

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O1

SC_Lib * Abc_SclReadFromFile(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  Vec_Str_t *vOut;
  char *__ptr;
  size_t sVar3;
  SC_Lib *p;
  char *__dest;
  int iVar4;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    p = (SC_Lib *)0x0;
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
  }
  else {
    __ptr = (char *)0x0;
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    rewind(__stream);
    vOut = (Vec_Str_t *)malloc(0x10);
    iVar1 = (int)lVar2;
    iVar4 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar4 = iVar1;
    }
    vOut->nSize = 0;
    vOut->nCap = iVar4;
    if (iVar4 != 0) {
      __ptr = (char *)malloc((long)iVar4);
    }
    vOut->pArray = __ptr;
    vOut->nSize = iVar4;
    if (iVar4 != iVar1) {
      __assert_fail("nFileSize == Vec_StrSize(vOut)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibScl.c"
                    ,0x1b4,"SC_Lib *Abc_SclReadFromFile(char *)");
    }
    sVar3 = fread(__ptr,1,(long)iVar4,__stream);
    if (iVar4 != (int)sVar3) {
      __assert_fail("nFileSize == Vec_StrSize(vOut)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibScl.c"
                    ,0x1b6,"SC_Lib *Abc_SclReadFromFile(char *)");
    }
    fclose(__stream);
    p = Abc_SclReadFromStr(vOut);
    if (p != (SC_Lib *)0x0) {
      if (pFileName == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        sVar3 = strlen(pFileName);
        __dest = (char *)malloc(sVar3 + 1);
        strcpy(__dest,pFileName);
      }
      p->pFileName = __dest;
      Abc_SclLibNormalize(p);
    }
    if (__ptr != (char *)0x0) {
      free(__ptr);
      vOut->pArray = (char *)0x0;
    }
    free(vOut);
  }
  return p;
}

Assistant:

SC_Lib * Abc_SclReadFromFile( char * pFileName )
{
    SC_Lib * p;
    FILE * pFile;
    Vec_Str_t * vOut;
    int nFileSize;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    nFileSize = ftell( pFile );  
    rewind( pFile ); 
    // load the contents
    vOut = Vec_StrAlloc( nFileSize );
    vOut->nSize = vOut->nCap;
    assert( nFileSize == Vec_StrSize(vOut) );
    nFileSize = fread( Vec_StrArray(vOut), 1, Vec_StrSize(vOut), pFile );
    assert( nFileSize == Vec_StrSize(vOut) );
    fclose( pFile );
    // read the library
    p = Abc_SclReadFromStr( vOut );
    if ( p != NULL )
        p->pFileName = Abc_UtilStrsav( pFileName );
    if ( p != NULL )
        Abc_SclLibNormalize( p );
    Vec_StrFree( vOut );
    return p;
}